

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O3

void __thiscall QDomElement::removeAttributeNS(QDomElement *this,QString *nsURI,QString *localName)

{
  QDomElementPrivate *this_00;
  QDomNodePrivate *pQVar1;
  long in_FS_OFFSET;
  QString local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QDomElementPrivate *)(this->super_QDomNode).impl;
  if (this_00 != (QDomElementPrivate *)0x0) {
    pQVar1 = QDomNamedNodeMapPrivate::namedItemNS(this_00->m_attr,nsURI,localName);
    if (pQVar1 != (QDomNodePrivate *)0x0) {
      local_30.d.d = (pQVar1->name).d.d;
      local_30.d.ptr = (pQVar1->name).d.ptr;
      local_30.d.size = (pQVar1->name).d.size;
      if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((local_30.d.d)->super_QArrayData).ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((local_30.d.d)->super_QArrayData).ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QDomElementPrivate::removeAttribute(this_00,&local_30);
      if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDomElement::removeAttributeNS(const QString& nsURI, const QString& localName)
{
    if (!impl)
        return;
    QDomNodePrivate *n = IMPL->attributeNodeNS(nsURI, localName);
    if (!n)
        return;
    IMPL->removeAttribute(n->nodeName());
}